

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

int canvas_undo_arrange(_glist *x,void *z,int action)

{
  int iVar1;
  t_gobj *ptVar2;
  _gobj *p_Var3;
  _gobj *p_Var4;
  _gobj *p_Var5;
  t_gobj *ptVar6;
  bool bVar7;
  bool bVar8;
  
  if ((x->field_0xe8 & 0x20) == 0) {
    canvas_editmode(x,1.0);
  }
  if (action == 0) {
    freebytes(z,8);
    return 1;
  }
  if (action != 2) {
    if (action != 1) {
      return 1;
    }
    iVar1 = *(int *)((long)z + 4);
    if (iVar1 == *z) {
      return 1;
    }
    ptVar6 = x->gl_list;
    if (iVar1 != 0 && ptVar6 != (t_gobj *)0x0) {
      do {
        iVar1 = iVar1 + -1;
        ptVar6 = ptVar6->g_next;
        if (ptVar6 == (_gobj *)0x0) break;
      } while (iVar1 != 0);
    }
    glist_noselect(x);
    glist_select(x,ptVar6);
    iVar1 = *(int *)((long)z + 4);
    ptVar2 = x->gl_list;
    if (iVar1 == 0) {
      iVar1 = *z;
      if (iVar1 != 0 && ptVar2 != (t_gobj *)0x0) {
        do {
          iVar1 = iVar1 + -1;
          ptVar2 = ptVar2->g_next;
          if (ptVar2 == (t_gobj *)0x0) break;
        } while (iVar1 != 0);
      }
      p_Var3 = ptVar2->g_next;
      x->gl_list = ptVar6->g_next;
    }
    else {
      p_Var3 = ptVar2;
      if (iVar1 != 1 && ptVar2 != (t_gobj *)0x0) {
        iVar1 = iVar1 + -2;
        do {
          p_Var3 = p_Var3->g_next;
          bVar7 = iVar1 != 0;
          iVar1 = iVar1 + -1;
          if (p_Var3 == (_gobj *)0x0) break;
        } while (bVar7);
      }
      p_Var3->g_next = (_gobj *)0x0;
      iVar1 = *z;
      if (iVar1 == 0) {
        ptVar6->g_next = ptVar2;
        x->gl_list = ptVar6;
        goto LAB_0013e0c9;
      }
      ptVar2 = x->gl_list;
      if (iVar1 != 1 && ptVar2 != (t_gobj *)0x0) {
        iVar1 = iVar1 + -2;
        do {
          ptVar2 = ptVar2->g_next;
          bVar7 = iVar1 != 0;
          iVar1 = iVar1 + -1;
          if (ptVar2 == (_gobj *)0x0) break;
        } while (bVar7);
      }
      p_Var3 = ptVar2->g_next;
    }
    ptVar2->g_next = ptVar6;
    ptVar6->g_next = p_Var3;
LAB_0013e0c9:
    if ((x->field_0xe8 & 1) != 0) {
      canvas_redraw(x);
    }
    return 1;
  }
  iVar1 = *z;
  if (*(int *)((long)z + 4) == iVar1) {
    return 1;
  }
  ptVar6 = x->gl_list;
  if (iVar1 != 0 && ptVar6 != (t_gobj *)0x0) {
    do {
      iVar1 = iVar1 + -1;
      ptVar6 = ptVar6->g_next;
      if (ptVar6 == (_gobj *)0x0) break;
    } while (iVar1 != 0);
  }
  glist_noselect(x);
  glist_select(x,ptVar6);
  ptVar2 = x->gl_list;
  if (ptVar2 == ptVar6 || ptVar2 == (t_gobj *)0x0) {
    p_Var3 = (_gobj *)0x0;
LAB_0013e06a:
    p_Var4 = ptVar6->g_next;
    bVar7 = p_Var4 == (_gobj *)0x0;
    if (ptVar2 != (t_gobj *)0x0) goto LAB_0013e0f1;
    p_Var5 = (_gobj *)0x0;
  }
  else {
    p_Var3 = ptVar2;
    if (*z != 1) {
      iVar1 = *z + -2;
      do {
        p_Var3 = p_Var3->g_next;
        bVar7 = iVar1 != 0;
        iVar1 = iVar1 + -1;
        if (p_Var3 == (_gobj *)0x0) break;
      } while (bVar7);
      goto LAB_0013e06a;
    }
    p_Var4 = ptVar6->g_next;
    bVar7 = p_Var4 == (_gobj *)0x0;
LAB_0013e0f1:
    iVar1 = 2;
    p_Var5 = ptVar2;
    do {
      p_Var5 = p_Var5->g_next;
      iVar1 = iVar1 + -1;
    } while (p_Var5 != (_gobj *)0x0);
    p_Var5 = ptVar2;
    if (iVar1 != 1) {
      iVar1 = -iVar1;
      do {
        p_Var5 = p_Var5->g_next;
        bVar8 = iVar1 != 0;
        iVar1 = iVar1 + -1;
        if (p_Var5 == (_gobj *)0x0) break;
      } while (bVar8);
    }
  }
  if (*(int *)((long)z + 4) == 0) {
    x->gl_list = ptVar6;
    ptVar6->g_next = ptVar2;
    if (p_Var3 == (_gobj *)0x0) goto LAB_0013e168;
    if (bVar7) {
      p_Var3->g_next = (_gobj *)0x0;
      goto LAB_0013e168;
    }
  }
  else {
    p_Var5->g_next = ptVar6;
    ptVar6->g_next = (_gobj *)0x0;
    if (p_Var3 == (_gobj *)0x0) {
      x->gl_list = p_Var4;
      goto LAB_0013e168;
    }
  }
  p_Var3->g_next = p_Var4;
LAB_0013e168:
  canvas_dirty(x,1.0);
  return 1;
}

Assistant:

int canvas_undo_arrange(t_canvas *x, void *z, int action)
{
    t_undo_arrange *buf = z;
    t_gobj *y=NULL, *prev=NULL, *next=NULL;

    if (!x->gl_edit)
        canvas_editmode(x, 1);

    switch(action)
    {

    case UNDO_UNDO:
        if(buf->u_newindex == buf->u_previndex) return 1;
            /* this is our object */
        y = glist_nth(x, buf->u_newindex);

            /* select object */
        glist_noselect(x);
        glist_select(x, y);

        if (buf->u_newindex)
        {
                /* if it is the last object */

                /* first previous object should point to nothing */
            prev = glist_nth(x, buf->u_newindex - 1);
            prev->g_next = NULL;

                /* now we reuse vars for the following:
                   old index should be right before the object previndex
                   is pointing to as the object was moved to the end */

                /* old position is not first */
            if (buf->u_previndex)
            {
                prev = glist_nth(x, buf->u_previndex - 1);
                next = prev->g_next;

                    /* now readjust pointers */
                prev->g_next = y;
                y->g_next = next;
            }
                /* old position is first */
            else {
                prev = NULL;
                next = x->gl_list;

                    /* now readjust pointers */
                y->g_next = next;
                x->gl_list = y;
            }
        }
        else {
                /* if it is the first object */

                /* old index should be right after the object previndex
                   is pointing to as the object was moved to the end */
            prev = glist_nth(x, buf->u_previndex);

                /* next may be NULL and that is ok */
            next = prev->g_next;

                /* first glist pointer needs to point to the second object */
            x->gl_list = y->g_next;

                /* now readjust pointers */
            prev->g_next = y;
            y->g_next = next;
        }
            /* and finally redraw canvas */
        if (x->gl_havewindow)
            canvas_redraw(x);
        break;
    case UNDO_REDO:
    {
        t_gobj *oldy_prev=NULL, *oldy_next=NULL;
        int arrangeaction;

        if(buf->u_newindex == buf->u_previndex) return 1;
            /* find our object */
        y = glist_nth(x, buf->u_previndex);

            /* select object */
        glist_noselect(x);
        glist_select(x, y);

        if (!buf->u_newindex) arrangeaction = 4;
        else arrangeaction = 3;


            /* if there is an object before ours (in other words our index is > 0) */
        if (glist_getindex(x,y))
            oldy_prev = glist_nth(x, buf->u_previndex - 1);

            /* if there is an object after ours */
        if (y->g_next)
            oldy_next = y->g_next;

        canvas_doarrange(x, arrangeaction, y, oldy_prev, oldy_next);
    }
        break;
    case UNDO_FREE:
        t_freebytes(buf, sizeof(*buf));
    }
    return 1;
}